

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O0

vector<despot::State_*,_std::allocator<despot::State_*>_> * __thiscall
despot::POMDPX::ApproxInitialParticleSet
          (vector<despot::State_*,_std::allocator<despot::State_*>_> *__return_storage_ptr__,
          POMDPX *this)

{
  int iVar1;
  log_ostream *plVar2;
  ostream *this_00;
  undefined4 extraout_var;
  value_type local_60;
  vector<int,_std::allocator<int>_> local_58;
  value_type local_40;
  POMDPXState *state;
  double random_value;
  int i;
  undefined1 local_19;
  POMDPX *local_18;
  POMDPX *this_local;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  
  local_19 = 0;
  local_18 = this;
  this_local = (POMDPX *)__return_storage_ptr__;
  std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector(__return_storage_ptr__);
  iVar1 = logging::level();
  if ((0 < iVar1) && (iVar1 = logging::level(), 2 < iVar1)) {
    plVar2 = logging::stream(3);
    this_00 = std::operator<<(&plVar2->super_ostream,
                              "[POMDPX::ApproximatePrior] Drawing 1000 random particles from initial belief."
                             );
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  for (random_value._0_4_ = 0; random_value._0_4_ < 1000;
      random_value._0_4_ = random_value._0_4_ + 1) {
    state = (POMDPXState *)Random::NextDouble((Random *)&Random::RANDOM);
    iVar1 = (*(this->super_MDP)._vptr_MDP[0x19])(0x3f50624dd2f1a9fc,this,0xffffffff);
    local_40 = (value_type)CONCAT44(extraout_var,iVar1);
    Parser::ComputeState(&local_58,this->parser_,(double)state);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)(local_40 + 1),&local_58);
    std::vector<int,_std::allocator<int>_>::~vector(&local_58);
    local_60 = local_40;
    std::vector<despot::State_*,_std::allocator<despot::State_*>_>::push_back
              (__return_storage_ptr__,&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<State*> POMDPX::ApproxInitialParticleSet() const {
	vector<State*> particles;

	logi
		<< "[POMDPX::ApproximatePrior] Drawing 1000 random particles from initial belief."
		<< endl;
	for (int i = 0; i < 1000; i++) {
		double random_value = Random::RANDOM.NextDouble();
		POMDPXState* state = static_cast<POMDPXState*>(Allocate(-1, 0.001));
		state->vec_id = parser_->ComputeState(random_value);
		particles.push_back(state);
	}

	return particles;
}